

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecRe.c
# Opt level: O0

void Ree_ManCutMerge(Gia_Man_t *p,int iObj,int *pList0,int *pList1,Vec_Int_t *vCuts,
                    Hash_IntMan_t *pHash,Vec_Int_t *vData,Vec_Int_t *vXors)

{
  int iVar1;
  uint Entry;
  Gia_Obj_t *pObj;
  int local_94;
  int local_90;
  int iXor3;
  int iXor2;
  int Count;
  int pCut [6];
  int *local_68;
  int *pCut1;
  int *pCut0;
  uint local_50;
  int TruthC;
  int Truth;
  int Value;
  int c;
  int k;
  int i;
  int fVerbose;
  Hash_IntMan_t *pHash_local;
  Vec_Int_t *vCuts_local;
  int *pList1_local;
  int *pList0_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  local_90 = -1;
  local_94 = -1;
  Vec_IntFill(vCuts,2,1);
  Vec_IntPush(vCuts,iObj);
  Vec_IntPush(vCuts,0xaa);
  pCut1 = pList0 + 1;
  for (c = 0; c < *pList0; c = c + 1) {
    local_68 = pList1 + 1;
    for (Value = 0; Value < *pList1; Value = Value + 1) {
      iVar1 = Ree_ManCutMergeOne(pCut1,local_68,&iXor2);
      if ((iVar1 != 0) && (iVar1 = Ree_ManCutCheckEqual(vCuts,&iXor2), iVar1 == 0)) {
        pObj = Gia_ManObj(p,iObj);
        Entry = Ree_ManCutTruth(pObj,pCut1,local_68,&iXor2);
        local_50 = Entry;
        if ((Entry & 0x80) != 0) {
          local_50 = (Entry ^ 0xffffffff) & 0xff;
        }
        if ((local_50 == 0x66) && (local_90 == -1)) {
          local_90 = Vec_IntSize(vCuts);
        }
        else if ((local_50 == 0x69) && (local_94 == -1)) {
          local_94 = Vec_IntSize(vCuts);
        }
        Vec_IntAddToEntry(vCuts,0,1);
        for (Truth = 0; Truth <= iXor2; Truth = Truth + 1) {
          Vec_IntPush(vCuts,(&iXor2)[Truth]);
        }
        Vec_IntPush(vCuts,Entry);
        if (((((local_50 == 0x66) || (local_50 == 0x11)) || (local_50 == 0x22)) ||
            ((local_50 == 0x44 || (local_50 == 0x77)))) && (iXor2 == 2)) {
          iVar1 = Hsh_Int3ManInsert(pHash,Count,pCut[0],0);
          Vec_IntPushThree(vData,iObj,iVar1,Entry);
        }
        else if (((local_50 == 0x69) || (local_50 == 0x17)) ||
                ((local_50 == 0x2b || ((local_50 == 0x4d || (local_50 == 0x71)))))) {
          if (iXor2 != 3) {
            __assert_fail("pCut[0] == 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecRe.c"
                          ,0x127,
                          "void Ree_ManCutMerge(Gia_Man_t *, int, int *, int *, Vec_Int_t *, Hash_IntMan_t *, Vec_Int_t *, Vec_Int_t *)"
                         );
          }
          iVar1 = Hsh_Int3ManInsert(pHash,Count,pCut[0],pCut[1]);
          Vec_IntPushThree(vData,iObj,iVar1,Entry);
        }
      }
      local_68 = local_68 + (*local_68 + 2);
    }
    pCut1 = pCut1 + (*pCut1 + 2);
  }
  if (vXors != (Vec_Int_t *)0x0) {
    if (local_90 < 1) {
      if (local_94 < 1) {
        return;
      }
      pCut1 = Vec_IntEntryP(vCuts,local_94);
    }
    else {
      pCut1 = Vec_IntEntryP(vCuts,local_90);
    }
    Vec_IntPush(vXors,iObj);
    for (Truth = 1; Truth <= *pCut1; Truth = Truth + 1) {
      Vec_IntPush(vXors,pCut1[Truth]);
    }
    if (*pCut1 == 2) {
      Vec_IntPush(vXors,0);
    }
  }
  return;
}

Assistant:

void Ree_ManCutMerge( Gia_Man_t * p, int iObj, int * pList0, int * pList1, Vec_Int_t * vCuts, Hash_IntMan_t * pHash, Vec_Int_t * vData, Vec_Int_t * vXors )
{
    int fVerbose = 0;
    int i, k, c, Value, Truth, TruthC, * pCut0, * pCut1, pCut[6], Count = 0;
    int iXor2 = -1, iXor3 = -1;
    if ( fVerbose )
        printf( "Object %d\n", iObj );
    Vec_IntFill( vCuts, 2, 1 );
    Vec_IntPush( vCuts, iObj );
    Vec_IntPush( vCuts, 0xAA );
    Ree_ForEachCut( pList0, pCut0, i )
    Ree_ForEachCut( pList1, pCut1, k )
    {
        if ( !Ree_ManCutMergeOne(pCut0, pCut1, pCut) )
            continue;
        if ( Ree_ManCutCheckEqual(vCuts, pCut) )
            continue;
        Truth = TruthC = Ree_ManCutTruth(Gia_ManObj(p, iObj), pCut0, pCut1, pCut);
        //assert( Truth == Ree_ObjComputeTruth(p, iObj, pCut) );
        if ( Truth & 0x80 )
            Truth = 0xFF & ~Truth;
        if ( Truth == 0x66 && iXor2 == -1 )
            iXor2 = Vec_IntSize(vCuts);
        else if ( Truth == 0x69 && iXor3 == -1 )
            iXor3 = Vec_IntSize(vCuts);
        Vec_IntAddToEntry( vCuts, 0, 1 );  
        for ( c = 0; c <= pCut[0]; c++ )
            Vec_IntPush( vCuts, pCut[c] );
        Vec_IntPush( vCuts, TruthC );
        if ( (Truth == 0x66 || Truth == 0x11 || Truth == 0x22 || Truth == 0x44 || Truth == 0x77) && pCut[0] == 2 )
        {
            assert( pCut[0] == 2 );
            Value = Hsh_Int3ManInsert( pHash, pCut[1], pCut[2], 0 );
            Vec_IntPushThree( vData, iObj, Value, TruthC );
        }
        else if ( Truth == 0x69 || Truth == 0x17 || Truth == 0x2B || Truth == 0x4D || Truth == 0x71 )
        {
            assert( pCut[0] == 3 );
            Value = Hsh_Int3ManInsert( pHash, pCut[1], pCut[2], pCut[3] );
            Vec_IntPushThree( vData, iObj, Value, TruthC );
        }
        if ( fVerbose )
            Ree_ManCutPrint( pCut, ++Count, TruthC, iObj );
    }
    if ( !vXors )
        return;
    if ( iXor2 > 0 )
        pCut0 = Vec_IntEntryP( vCuts, iXor2 );
    else if ( iXor3 > 0 )
        pCut0 = Vec_IntEntryP( vCuts, iXor3 );
    else
        return;
    Vec_IntPush( vXors, iObj );
    for ( c = 1; c <= pCut0[0]; c++ )
        Vec_IntPush( vXors, pCut0[c] );
    if ( pCut0[0] == 2 )
        Vec_IntPush( vXors, 0 );
}